

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLsMassSetup(void *arkode_mem,realtype t,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  int iVar1;
  SUNLinearSolver_Type SVar2;
  SUNMatrix A;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_40;
  ARKodeMem local_38;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLsMassSetup",&local_38,&local_40);
  if (iVar1 != 0) {
    return iVar1;
  }
  SVar2 = SUNLinSolGetType(local_40->LS);
  if ((SVar2 == SUNLINEARSOLVER_MATRIX_EMBEDDED) ||
     (ABS(local_40->msetuptime - t) < local_38->uround * 100.0)) {
LAB_003e36e9:
    local_40->last_flag = 0;
    return 0;
  }
  if ((local_40->mtsetup != (ARKLsMassTimesSetupFn)0x0) &&
     ((local_40->time_dependent != 0 || (local_40->nmtsetup == 0)))) {
    iVar1 = (*local_40->mtsetup)(t,local_40->mt_data);
    local_40->last_flag = iVar1;
    local_40->nmtsetup = local_40->nmtsetup + 1;
    local_40->msetuptime = t;
    if (iVar1 != 0) {
      arkProcessError(local_38,iVar1,"ARKLS","arkLsMassSetup",
                      "The mass matrix x vector setup routine failed in an unrecoverable manner.");
      goto LAB_003e37f4;
    }
  }
  A = local_40->M;
  if (A == (SUNMatrix)0x0) {
    if (local_40->pset == (ARKLsMassPrecSetupFn)0x0) {
LAB_003e37f4:
      return local_40->last_flag;
    }
  }
  else {
    if ((local_40->time_dependent == 0) && (0 < local_40->nmsetups)) goto LAB_003e36e9;
    if (local_40->iterative == 0) {
      iVar1 = SUNMatZero(A);
      if (iVar1 != 0) goto LAB_003e381d;
      A = local_40->M;
    }
    iVar1 = (*local_40->mass)(t,A,local_40->M_data,vtemp1,vtemp2,vtemp3);
    local_40->msetuptime = t;
    if (iVar1 < 0) {
      arkProcessError(local_38,-9,"ARKLS","arkLsMassSetup",
                      "The mass matrix routine failed in an unrecoverable manner.");
      local_40->last_flag = -9;
      return -1;
    }
    if (iVar1 != 0) {
      local_40->last_flag = -10;
      return 1;
    }
    if ((local_40->iterative == 0) && (iVar1 = SUNMatCopy(local_40->M,local_40->M_lu), iVar1 != 0))
    {
LAB_003e381d:
      arkProcessError(local_38,-0xb,"ARKLS","arkLsMassSetup",
                      "A SUNMatrix routine failed in an unrecoverable manner.");
      local_40->last_flag = -0xb;
      return -0xb;
    }
    if ((local_40->mtimes == (ARKLsMassTimesVecFn)0x0) &&
       (local_40->M->ops->matvecsetup != (_func_int_SUNMatrix *)0x0)) {
      iVar1 = SUNMatMatvecSetup(local_40->M);
      local_40->nmvsetup = local_40->nmvsetup + 1;
      if (iVar1 != 0) goto LAB_003e381d;
    }
  }
  iVar1 = SUNLinSolSetup(local_40->LS,local_40->M_lu);
  local_40->last_flag = iVar1;
  local_40->nmsetups = local_40->nmsetups + 1;
  return iVar1;
}

Assistant:

int arkLsMassSetup(void *arkode_mem, realtype t, N_Vector vtemp1,
                   N_Vector vtemp2, N_Vector vtemp3)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  booleantype  call_mtsetup, call_mvsetup, call_lssetup;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLsMassSetup",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return(arkls_mem->last_flag);
  }

  /* if the most recent setup essentially matches the current time,
     just return with success */
  if (SUNRabs(arkls_mem->msetuptime - t) < FUZZ_FACTOR*ark_mem->uround) {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return(arkls_mem->last_flag);
  }

  /* Determine whether to call user-provided mtsetup routine */
  call_mtsetup = SUNFALSE;
  if ( (arkls_mem->mtsetup) &&
       (arkls_mem->time_dependent || (arkls_mem->nmtsetup == 0)) )
    call_mtsetup = SUNTRUE;

  /* call user-provided mtsetup routine if applicable */
  if (call_mtsetup) {
    arkls_mem->last_flag = arkls_mem->mtsetup(t, arkls_mem->mt_data);
    arkls_mem->nmtsetup++;
    arkls_mem->msetuptime = t;
    if (arkls_mem->last_flag != 0) {
      arkProcessError(ark_mem, arkls_mem->last_flag, "ARKLS",
                      "arkLsMassSetup", MSG_LS_MTSETUP_FAILED);
      return(arkls_mem->last_flag);
    }
  }

  /* Perform user-facing setup based on whether this is matrix-free */
  if (arkls_mem->M == NULL) {

    /*** matrix-free -- only call LS setup if preconditioner setup exists ***/
    call_lssetup = (arkls_mem->pset != NULL);
    /*** matrix-free -- dont call matvec setup ***/
    call_mvsetup = SUNFALSE;

  } else {

    /*** matrix-based ***/

    /* If mass matrix is not time dependent, and if it has been set up
       previously, then just reuse existing matrix and factorization */
    if (!arkls_mem->time_dependent && (arkls_mem->nmsetups > 0)) {
      arkls_mem->last_flag = ARKLS_SUCCESS;
      return(arkls_mem->last_flag);
    }

    /* Clear the mass matrix if necessary (direct linear solvers) */
    if (!(arkls_mem->iterative)) {
      retval = SUNMatZero(arkls_mem->M);
      if (retval) {
        arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, "ARKLS",
                        "arkLsMassSetup",  MSG_LS_SUNMAT_FAILED);
        arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
        return(arkls_mem->last_flag);
      }
    }

    /* Call user-supplied routine to fill the mass matrix */
    retval = arkls_mem->mass(t, arkls_mem->M, arkls_mem->M_data,
                             vtemp1, vtemp2, vtemp3);
    arkls_mem->msetuptime = t;
    if (retval < 0) {
      arkProcessError(ark_mem, ARKLS_MASSFUNC_UNRECVR, "ARKLS",
                      "arkLsMassSetup",  MSG_LS_MASSFUNC_FAILED);
      arkls_mem->last_flag = ARKLS_MASSFUNC_UNRECVR;
      return(-1);
    }
    if (retval > 0) {
      arkls_mem->last_flag = ARKLS_MASSFUNC_RECVR;
      return(1);
    }

    /* Copy M into M_lu for factorization (direct linear solvers) */
    if (!(arkls_mem->iterative)) {
      retval = SUNMatCopy(arkls_mem->M, arkls_mem->M_lu);
      if (retval) {
        arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, "ARKLS",
                        "arkLsMassSetup",  MSG_LS_SUNMAT_FAILED);
        arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
        return(arkls_mem->last_flag);
      }
    }

    /* signal call to matvec setup routine only if the user didn't provide
       mtimes and the SUNMatrix implements the matvecsetup routine */
    if ((!arkls_mem->mtimes) && (arkls_mem->M->ops->matvecsetup))
      call_mvsetup = SUNTRUE;
    else
      call_mvsetup = SUNFALSE;

    /* signal call to LS setup routine */
    call_lssetup = SUNTRUE;

  }

  /* Call matvec setup routine if applicable */
  if (call_mvsetup) {
    retval = SUNMatMatvecSetup(arkls_mem->M);
    arkls_mem->nmvsetup++;
    if (retval) {
      arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, "ARKLS",
                      "arkLsMassSetup",  MSG_LS_SUNMAT_FAILED);
      arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
      return(arkls_mem->last_flag);
    }
  }

  /* Call LS setup routine if applicable, and return */
  if (call_lssetup) {
    arkls_mem->last_flag = SUNLinSolSetup(arkls_mem->LS,
                                          arkls_mem->M_lu);
    arkls_mem->nmsetups++;
  }

  return(arkls_mem->last_flag);
}